

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# replace_desc_array_access_using_var_index.cpp
# Opt level: O0

void __thiscall
spvtools::opt::ReplaceDescArrayAccessUsingVarIndex::AddBranchToBlock
          (ReplaceDescArrayAccessUsingVarIndex *this,BasicBlock *parent_block,
          uint32_t branch_destination)

{
  IRContext *context;
  undefined1 local_40 [8];
  InstructionBuilder builder;
  uint32_t branch_destination_local;
  BasicBlock *parent_block_local;
  ReplaceDescArrayAccessUsingVarIndex *this_local;
  
  builder._28_4_ = branch_destination;
  context = Pass::context(&this->super_Pass);
  InstructionBuilder::InstructionBuilder
            ((InstructionBuilder *)local_40,context,parent_block,
             (anonymous_namespace)::kAnalysisDefUseAndInstrToBlockMapping);
  InstructionBuilder::AddBranch((InstructionBuilder *)local_40,builder._28_4_);
  return;
}

Assistant:

void ReplaceDescArrayAccessUsingVarIndex::AddBranchToBlock(
    BasicBlock* parent_block, uint32_t branch_destination) const {
  InstructionBuilder builder{context(), parent_block,
                             kAnalysisDefUseAndInstrToBlockMapping};
  builder.AddBranch(branch_destination);
}